

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.h
# Opt level: O0

SQObjectPtr * __thiscall SQObjectPtr::operator=(SQObjectPtr *this,SQObject *obj)

{
  SQObjectType SVar1;
  SQTable *pSVar2;
  SQTable *pSVar3;
  SQUnsignedInteger SVar4;
  SQObjectValue unOldVal;
  SQObjectType tOldType;
  SQObject *obj_local;
  SQObjectPtr *this_local;
  
  SVar1 = (this->super_SQObject)._type;
  pSVar2 = (this->super_SQObject)._unVal.pTable;
  (this->super_SQObject)._unVal = obj->_unVal;
  (this->super_SQObject)._type = obj->_type;
  if (((this->super_SQObject)._type & 0x8000000) != 0) {
    pSVar3 = (this->super_SQObject)._unVal.pTable;
    (pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
         (pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef + 1;
  }
  if ((SVar1 & 0x8000000) != 0) {
    SVar4 = (pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef - 1;
    (pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = SVar4;
    if (SVar4 == 0) {
      (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  return this;
}

Assistant:

inline SQObjectPtr& operator=(const SQObject& obj)
    {
        SQObjectType tOldType;
        SQObjectValue unOldVal;
        tOldType=_type;
        unOldVal=_unVal;
        _unVal = obj._unVal;
        _type = obj._type;
        __AddRef(_type,_unVal);
        __Release(tOldType,unOldVal);
        return *this;
    }